

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool ConnectToSocket(Sock *sock,sockaddr *sockaddr,socklen_t len,string *dest_str,
                    bool manual_connection)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  char *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined1 in_R8B;
  long in_FS_OFFSET;
  Event requested;
  int nErr;
  socklen_t sockerr_len;
  int sockerr;
  Event occurred;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe0c;
  undefined8 in_stack_fffffffffffffe10;
  int err;
  char *in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  uint uVar7;
  undefined8 in_stack_fffffffffffffe58;
  LogFlags in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  int iVar8;
  ConstevalFormatString<2U> in_stack_fffffffffffffea8;
  ConstevalFormatString<2U> in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  char *pcVar9;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 uVar10;
  undefined3 in_stack_fffffffffffffed4;
  bool local_101;
  undefined4 local_e0;
  int local_dc [17];
  undefined8 local_98;
  char local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Level in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined1 local_28 [32];
  long local_8;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  err = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  uVar10 = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = CONCAT13(in_R8B,in_stack_fffffffffffffed4) & 0x1ffffff;
  iVar2 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI,in_EDX);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    if (((iVar2 != 0x73) && (iVar2 != 0xb)) && (iVar2 != 0x16)) {
      __errno_location();
      args_1 = &local_88;
      NetworkErrorString_abi_cxx11_(err);
      LogConnectFailure<std::__cxx11::string,std::__cxx11::string>
                ((bool)uVar10,in_stack_fffffffffffffea8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),args_1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_101 = false;
      goto LAB_01989e9a;
    }
    uVar10 = 3;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),(int *)0x1989a15);
    uVar5 = (**(code **)(*in_RDI + 0x70))(in_RDI,local_98,3,&local_89);
    if ((uVar5 & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      pcVar9 = "wait for connect to %s failed: %s\n";
      __errno_location();
      iVar8 = (int)((ulong)local_28 >> 0x20);
      NetworkErrorString_abi_cxx11_(err);
      uVar6 = 2;
      logging_function._M_len._4_4_ = uVar7;
      logging_function._M_len._0_4_ = iVar2;
      logging_function._M_str = in_RCX;
      source_file._M_str._0_7_ = in_stack_fffffffffffffec8;
      source_file._M_len = (size_t)pcVar9;
      source_file._M_str._7_1_ = uVar10;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,iVar8,in_stack_fffffffffffffe70,
                 in_stack_ffffffffffffffb0,in_stack_fffffffffffffeb8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffc8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,uVar6));
      local_101 = false;
      goto LAB_01989e9a;
    }
    if (local_89 == '\0') {
      bVar1 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),Trace)
      ;
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        logging_function_00._M_len._4_4_ = uVar7;
        logging_function_00._M_len._0_4_ = iVar2;
        logging_function_00._M_str = in_RCX;
        source_file_00._M_str._0_7_ = in_stack_fffffffffffffec8;
        source_file_00._M_len = in_stack_fffffffffffffec0;
        source_file_00._M_str._7_1_ = uVar10;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_00,source_file_00,iVar8,in_stack_fffffffffffffe70,
                   in_stack_ffffffffffffffb0,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffffeb8.fmt,
                   in_stack_ffffffffffffffc0);
      }
      local_101 = false;
      goto LAB_01989e9a;
    }
    local_e0 = 4;
    iVar3 = (**(code **)(*in_RDI + 0x48))(in_RDI,1,4,local_dc,&local_e0);
    if (iVar3 == -1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      pcVar9 = in_RCX;
      __errno_location();
      NetworkErrorString_abi_cxx11_(err);
      uVar6 = 2;
      logging_function_01._M_len._4_4_ = uVar7;
      logging_function_01._M_len._0_4_ = iVar2;
      logging_function_01._M_str = pcVar9;
      source_file_01._M_str._0_7_ = in_stack_fffffffffffffec8;
      source_file_01._M_len = in_stack_fffffffffffffec0;
      source_file_01._M_str._7_1_ = uVar10;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function_01,source_file_01,iVar8,(LogFlags)in_RCX,in_stack_ffffffffffffffb0
                 ,in_stack_fffffffffffffeb8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,uVar6));
      local_101 = false;
      goto LAB_01989e9a;
    }
    if (local_dc[0] != 0) {
      uVar7 = uVar7 >> 0x18;
      NetworkErrorString_abi_cxx11_(err);
      LogConnectFailure<std::__cxx11::string,std::__cxx11::string>
                (SUB81((ulong)in_RCX >> 0x38,0),in_stack_fffffffffffffea8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar7,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_101 = false;
      goto LAB_01989e9a;
    }
  }
  local_101 = true;
LAB_01989e9a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_101;
}

Assistant:

static bool ConnectToSocket(const Sock& sock, struct sockaddr* sockaddr, socklen_t len, const std::string& dest_str, bool manual_connection)
{
    // Connect to `sockaddr` using `sock`.
    if (sock.Connect(sockaddr, len) == SOCKET_ERROR) {
        int nErr = WSAGetLastError();
        // WSAEINVAL is here because some legacy version of winsock uses it
        if (nErr == WSAEINPROGRESS || nErr == WSAEWOULDBLOCK || nErr == WSAEINVAL)
        {
            // Connection didn't actually fail, but is being established
            // asynchronously. Thus, use async I/O api (select/poll)
            // synchronously to check for successful connection with a timeout.
            const Sock::Event requested = Sock::RECV | Sock::SEND;
            Sock::Event occurred;
            if (!sock.Wait(std::chrono::milliseconds{nConnectTimeout}, requested, &occurred)) {
                LogPrintf("wait for connect to %s failed: %s\n",
                          dest_str,
                          NetworkErrorString(WSAGetLastError()));
                return false;
            } else if (occurred == 0) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "connection attempt to %s timed out\n", dest_str);
                return false;
            }

            // Even if the wait was successful, the connect might not
            // have been successful. The reason for this failure is hidden away
            // in the SO_ERROR for the socket in modern systems. We read it into
            // sockerr here.
            int sockerr;
            socklen_t sockerr_len = sizeof(sockerr);
            if (sock.GetSockOpt(SOL_SOCKET, SO_ERROR, (sockopt_arg_type)&sockerr, &sockerr_len) ==
                SOCKET_ERROR) {
                LogPrintf("getsockopt() for %s failed: %s\n", dest_str, NetworkErrorString(WSAGetLastError()));
                return false;
            }
            if (sockerr != 0) {
                LogConnectFailure(manual_connection,
                                  "connect() to %s failed after wait: %s",
                                  dest_str,
                                  NetworkErrorString(sockerr));
                return false;
            }
        }
#ifdef WIN32
        else if (WSAGetLastError() != WSAEISCONN)
#else
        else
#endif
        {
            LogConnectFailure(manual_connection, "connect() to %s failed: %s", dest_str, NetworkErrorString(WSAGetLastError()));
            return false;
        }
    }
    return true;
}